

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O1

CVmHashEntry * __thiscall CVmHashTable::find(CVmHashTable *this,char *str,size_t len)

{
  uint uVar1;
  int iVar2;
  CVmHashEntry *pCVar3;
  
  uVar1 = (*this->hash_function_->_vptr_CVmHashFunc[2])();
  pCVar3 = this->table_[(int)this->table_size_ - 1U & uVar1];
  while( true ) {
    if (pCVar3 == (CVmHashEntry *)0x0) {
      return (CVmHashEntry *)0x0;
    }
    iVar2 = (*pCVar3->_vptr_CVmHashEntry[2])(pCVar3,str,len);
    if (iVar2 != 0) break;
    pCVar3 = pCVar3->nxt_;
  }
  return pCVar3;
}

Assistant:

CVmHashEntry *CVmHashTable::find(const char *str, size_t len) const
{
    unsigned int hash;
    CVmHashEntry *entry;

    /* compute the hash value for this entry */
    hash = compute_hash(str, len);

    /* scan the list at this hash value looking for a match */
    for (entry = table_[hash] ; entry ; entry = entry->nxt_)
    {
        /* if this one matches, return it */
        if (entry->matches(str, len))
            return entry;
    }

    /* didn't find anything */
    return 0;
}